

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O1

void notify(nsync_note n)

{
  nsync_mu *mu;
  nsync_mu *mu_00;
  nsync_note parent;
  int iVar1;
  nsync_time *pnVar2;
  __syscall_slong_t *p_Var3;
  nsync_time a;
  
  mu = &n->note_mu;
  nsync_mu_lock(mu);
  if (n->notified == 0) {
    if (n->expiry_time_valid == 0) {
      pnVar2 = &nsync_time_no_deadline;
      p_Var3 = &nsync_time_no_deadline.tv_nsec;
    }
    else {
      pnVar2 = &n->expiry_time;
      p_Var3 = &(n->expiry_time).tv_nsec;
    }
  }
  else {
    p_Var3 = &nsync_time_zero.tv_nsec;
    pnVar2 = &nsync_time_zero;
  }
  a.tv_nsec = *p_Var3;
  a.tv_sec = pnVar2->tv_sec;
  iVar1 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar1) {
    n->disconnecting = n->disconnecting + 1;
    parent = n->parent;
    if (parent == (nsync_note)0x0) {
      note_notify_child(n,(nsync_note)0x0);
    }
    else {
      mu_00 = &parent->note_mu;
      iVar1 = nsync_mu_trylock(mu_00);
      if (iVar1 == 0) {
        nsync_mu_unlock(mu);
        nsync_mu_lock(mu_00);
        nsync_mu_lock(mu);
      }
      note_notify_child(n,parent);
      nsync_mu_unlock(mu_00);
    }
    n->disconnecting = n->disconnecting - 1;
  }
  nsync_mu_unlock(mu);
  return;
}

Assistant:

static void notify (nsync_note n) {
	nsync_time t;
	nsync_mu_lock (&n->note_mu);
	t = NOTIFIED_TIME (n);
	if (nsync_time_cmp (t, nsync_time_zero) > 0) {
		nsync_note parent;
		n->disconnecting++;
		parent = n->parent;
		if (parent != NULL && !nsync_mu_trylock (&parent->note_mu)) {
			nsync_mu_unlock (&n->note_mu);
			nsync_mu_lock (&parent->note_mu);
			nsync_mu_lock (&n->note_mu);
		}
		note_notify_child (n, parent);
		if (parent != NULL) {
			nsync_mu_unlock (&parent->note_mu);
		}
		n->disconnecting--;
	}
	nsync_mu_unlock (&n->note_mu);
}